

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::addToolBarBreak(QMainWindowLayout *this,ToolBarArea area)

{
  bool bVar1;
  ToolBarArea area_00;
  ToolBarArea in_ESI;
  long *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  DockPosition DVar2;
  QToolBarAreaLayout *this_00;
  
  DVar2 = (DockPosition)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  area_00 = validateToolBarArea(in_ESI);
  this_00 = (QToolBarAreaLayout *)(in_RDI + 0x14);
  toDockPos(area_00);
  QToolBarAreaLayout::addToolBarBreak(this_00,DVar2);
  bVar1 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f5dd4);
  if (bVar1) {
    DVar2 = (DockPosition)((ulong)(in_RDI + 0x7b) >> 0x20);
    toDockPos(area_00);
    QToolBarAreaLayout::addToolBarBreak(this_00,DVar2);
  }
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QMainWindowLayout::addToolBarBreak(Qt::ToolBarArea area)
{
    area = validateToolBarArea(area);

    layoutState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));
    if (savedState.isValid())
        savedState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));

    invalidate();
}